

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

FieldDef * __thiscall
flatbuffers::Parser::AddField(Parser *this,StructDef *struct_def,string *name,Type *type)

{
  StructDef *pSVar1;
  BaseType BVar2;
  bool bVar3;
  FieldDef *this_00;
  size_t sVar4;
  size_t sVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (FieldDef *)operator_new(0xe0);
  FieldDef::FieldDef(this_00);
  (this_00->value).offset =
       ((uint)(*(int *)&(struct_def->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
              *(int *)&(struct_def->fields).vec.
                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 2) + 4 & 0xfffe;
  std::__cxx11::string::_M_assign((string *)this_00);
  (this_00->value).type.enum_def = type->enum_def;
  BVar2 = type->element;
  pSVar1 = type->struct_def;
  (this_00->value).type.base_type = type->base_type;
  (this_00->value).type.element = BVar2;
  (this_00->value).type.struct_def = pSVar1;
  if (struct_def->fixed == true) {
    sVar4 = InlineSize(type);
    sVar5 = InlineAlignment(type);
    uVar6 = struct_def->minalign;
    if (struct_def->minalign <= sVar5) {
      uVar6 = sVar5;
    }
    struct_def->minalign = uVar6;
    StructDef::PadLastField(struct_def,sVar5);
    sVar5 = struct_def->bytesize;
    (this_00->value).offset = (int)sVar5;
    struct_def->bytesize = sVar4 + sVar5;
  }
  bVar3 = SymbolTable<flatbuffers::FieldDef>::Add(&struct_def->fields,name,this_00);
  if (!bVar3) {
    return this_00;
  }
  std::operator+(&local_50,"field already exists: ",name);
  Error(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

FieldDef &Parser::AddField(StructDef &struct_def,
                           const std::string &name,
                           const Type &type) {
  auto &field = *new FieldDef();
  field.value.offset =
    FieldIndexToOffset(static_cast<voffset_t>(struct_def.fields.vec.size()));
  field.name = name;
  field.value.type = type;
  if (struct_def.fixed) {  // statically compute the field offset
    auto size = InlineSize(type);
    auto alignment = InlineAlignment(type);
    // structs_ need to have a predictable format, so we need to align to
    // the largest scalar
    struct_def.minalign = std::max(struct_def.minalign, alignment);
    struct_def.PadLastField(alignment);
    field.value.offset = static_cast<uoffset_t>(struct_def.bytesize);
    struct_def.bytesize += size;
  }
  if (struct_def.fields.Add(name, &field))
    Error("field already exists: " + name);
  return field;
}